

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetStencilOpLiteralName(STENCIL_OP StencilOp)

{
  Char *pCVar1;
  char (*in_R8) [2];
  string msg;
  int local_2c;
  string local_28;
  
  if (StencilOp < STENCIL_OP_NUM_OPS) {
    pCVar1 = &DAT_00922ed8 + *(int *)(&DAT_00922ed8 + (ulong)StencilOp * 4);
  }
  else {
    local_2c = (int)(char)StencilOp;
    FormatString<char[31],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Unexpected stencil operation (",(char (*) [31])&local_2c,
               (uint *)0x930f15,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetStencilOpLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x3cb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = "UNKNOWN";
  }
  return pCVar1;
}

Assistant:

const Char* GetStencilOpLiteralName(STENCIL_OP StencilOp)
{
#define STENCIL_OP_TO_STR(Op) \
    case Op: return #Op

    static_assert(STENCIL_OP_NUM_OPS == 9, "Please update the switch below to handle the new stencil op");
    switch (StencilOp)
    {
        STENCIL_OP_TO_STR(STENCIL_OP_UNDEFINED);
        STENCIL_OP_TO_STR(STENCIL_OP_KEEP);
        STENCIL_OP_TO_STR(STENCIL_OP_ZERO);
        STENCIL_OP_TO_STR(STENCIL_OP_REPLACE);
        STENCIL_OP_TO_STR(STENCIL_OP_INCR_SAT);
        STENCIL_OP_TO_STR(STENCIL_OP_DECR_SAT);
        STENCIL_OP_TO_STR(STENCIL_OP_INVERT);
        STENCIL_OP_TO_STR(STENCIL_OP_INCR_WRAP);
        STENCIL_OP_TO_STR(STENCIL_OP_DECR_WRAP);

        default:
            UNEXPECTED("Unexpected stencil operation (", static_cast<Uint32>(StencilOp), ")");
            return "UNKNOWN";
    }
#undef STENCIL_OP_TO_STR
}